

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  ctrl_t *pcVar1;
  undefined **ppuVar2;
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  ushort uVar4;
  char *pcVar5;
  ushort *puVar6;
  Context *pCVar7;
  pointer pcVar8;
  OneofDescriptor *oneof;
  Nullable<const_char_*> pcVar9;
  string *psVar10;
  bool bVar11;
  int iVar12;
  JavaType type;
  ImmutableFieldLiteGenerator *pIVar13;
  reference ppVar14;
  Descriptor *pDVar15;
  Nonnull<const_char_*> pcVar16;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar17;
  FieldDescriptor *pFVar18;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  int iVar19;
  uint uVar20;
  long lVar21;
  Nonnull<char_*> pcVar22;
  long lVar23;
  size_t sVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *eq;
  long *plVar25;
  char *pcVar26;
  long lVar27;
  uint uVar28;
  char *pcVar29;
  iterator iVar30;
  string_view begin_varname;
  string_view text;
  const_iterator other;
  string_view begin_varname_00;
  string_view text_00;
  string_view begin_varname_01;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view text_06;
  string_view begin_varname_04;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view format;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  ImmutableMessageLiteGenerator messageGenerator;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string builder_type;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_180 [48];
  undefined1 local_150 [32];
  long local_130 [2];
  undefined1 local_120 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  int local_dc;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_d8;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
  local_b8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  FieldDescriptor *extraout_RDX_07;
  
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (pDVar15->containing_type_ == (Descriptor *)0x0) {
    bVar11 = NestedInFileClass(pDVar15,true);
    pcVar29 = " ";
    if (bVar11) {
      pcVar29 = " static ";
    }
  }
  else {
    pcVar29 = " static ";
  }
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_180,(char (*) [2])0x122a33e,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  pcVar26 = anon_var_dwarf_a12c75 + 5;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_150,(char (*) [2])0x12347b2,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  eq = &local_100;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)&local_a8,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_180,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_120,0,(hasher *)&local_d8,(key_equal *)eq->_M_local_buf,
             (allocator_type *)&local_1a8);
  lVar21 = -0x60;
  plVar25 = local_130;
  do {
    if (plVar25 != (long *)plVar25[-2]) {
      operator_delete((long *)plVar25[-2],*plVar25 + 1);
    }
    plVar25 = plVar25 + -6;
    lVar21 = lVar21 + 0x30;
  } while (lVar21 != 0);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_180,&local_a8,(char (*) [7])"static");
  pcVar5 = *(char **)(local_180._8_8_ + 0x18);
  pcVar22 = (Nonnull<char_*>)(local_180._8_8_ + 0x10);
  strlen(pcVar29);
  std::__cxx11::string::_M_replace((ulong)pcVar22,0,pcVar5,(ulong)pcVar29);
  puVar6 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  pcVar1 = local_180 + 0x10;
  local_180._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,(long)puVar6 + ~(ulong)*puVar6,(long)puVar6 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>(&local_d8,&local_a8,(char (*) [10])0x134d25a);
  std::__cxx11::string::operator=
            ((string *)((long)local_d8.first.field_1.slot_ + 0x10),(string *)local_180);
  pDVar15 = extraout_RDX;
  if ((ctrl_t *)local_180._0_8_ != pcVar1) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
    pDVar15 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)local_180,(java *)(this->super_MessageGenerator).descriptor_,pDVar15);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>(&local_d8,&local_a8,(char (*) [17])"extra_interfaces");
  std::__cxx11::string::operator=
            ((string *)((long)local_d8.first.field_1.slot_ + 0x10),(string *)local_180);
  if ((ctrl_t *)local_180._0_8_ != pcVar1) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
  }
  bVar11 = (((this->super_MessageGenerator).descriptor_)->options_->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_180,&local_a8,(char (*) [12])"deprecation");
  if (bVar11 != false) {
    pcVar26 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)(local_180._8_8_ + 0x10),0,*(char **)(local_180._8_8_ + 0x18),(ulong)pcVar26);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  pCVar7 = this->context_;
  local_80[4] = (pCVar7->options_).opensource_runtime;
  local_80[5] = (pCVar7->options_).annotate_code;
  local_80[0] = (pCVar7->options_).generate_immutable_code;
  local_80[1] = (pCVar7->options_).generate_mutable_code;
  local_80[2] = (pCVar7->options_).generate_shared_code;
  local_80[3] = (pCVar7->options_).enforce_lite;
  pcVar8 = (pCVar7->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar8,
             pcVar8 + (pCVar7->options_).annotation_list_file._M_string_length);
  pcVar8 = (pCVar7->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar8,
             pcVar8 + (pCVar7->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar7->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar7->options_).jvm_dsl;
  WriteMessageDocComment(printer,pDVar15,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  ppuVar2 = (undefined **)(local_180 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  pCVar7 = this->context_;
  local_180._0_8_ = ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,anon_var_dwarf_a12c75 + 5);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (pCVar7,printer,pDVar15,true,(string *)local_180);
  if ((undefined **)local_180._0_8_ != ppuVar2) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
  }
  local_d8.first.ctrl_ = &local_d8.second;
  local_d8.first.field_1.slot_ = (slot_type *)0x0;
  local_d8.second = false;
  if (((this->super_MessageGenerator).descriptor_)->extension_range_count_ < 1) {
    text_25._M_str =
         "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_25._M_len = 0xd7;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a8,text_25);
    std::__cxx11::string::_M_replace
              ((ulong)&local_d8,0,(char *)local_d8.first.field_1.slot_,0x138448c);
  }
  else {
    text_24._M_str =
         "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_24._M_len = 0xe7;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a8,text_24);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_100,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
               true);
    local_180._8_8_ = (slot_type *)0x0;
    local_180[0x10] = false;
    local_1a8._M_dataplus._M_p = (pointer)local_100._8_8_;
    local_1a8._M_string_length = local_100._M_allocated_capacity;
    format._M_str = (char *)&local_1a8;
    format._M_len = (size_t)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>";
    local_180._0_8_ = ppuVar2;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)local_180,(Nonnull<std::string_*>)0x41,format,
               (Nullable<const_absl::string_view_*>)0x1,(size_t)eq);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)local_180);
    if ((undefined **)local_180._0_8_ != ppuVar2) {
      operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_allocated_capacity != &local_f0) {
      operator_delete((void *)local_100._M_allocated_capacity,local_f0._M_allocated_capacity + 1);
    }
  }
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,begin_varname,end_varname,(this->super_MessageGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateConstructor(this,printer);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  uVar17 = extraout_RDX_01;
  if (0 < pDVar15->enum_type_count_) {
    lVar21 = 0;
    lVar27 = 0;
    do {
      EnumLiteGenerator::EnumLiteGenerator
                ((EnumLiteGenerator *)local_180,
                 (EnumDescriptor *)(&pDVar15->enum_types_->super_SymbolBase + lVar21),true,
                 this->context_);
      EnumLiteGenerator::Generate((EnumLiteGenerator *)local_180,printer);
      EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_180);
      lVar27 = lVar27 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x58;
      uVar17 = extraout_RDX_02;
    } while (lVar27 < pDVar15->enum_type_count_);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar15->nested_type_count_) {
    lVar21 = 0;
    lVar27 = 0;
    do {
      if (*(char *)(*(long *)((long)&pDVar15->nested_types_->options_ + lVar21) + 0x53) == '\0') {
        pDVar15 = (this->super_MessageGenerator).descriptor_;
        lVar23 = (long)pDVar15->nested_type_count_;
        if (lVar27 < lVar23) {
          pcVar16 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar27,lVar23,"index < nested_type_count()");
        }
        if (pcVar16 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_100,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa8a,pcVar16);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_100);
        }
        ImmutableMessageLiteGenerator
                  ((ImmutableMessageLiteGenerator *)local_180,
                   (Descriptor *)(&pDVar15->nested_types_->super_SymbolBase + lVar21),this->context_
                  );
        GenerateInterface((ImmutableMessageLiteGenerator *)local_180,printer);
        Generate((ImmutableMessageLiteGenerator *)local_180,printer);
        local_180._0_8_ = &PTR__ImmutableMessageLiteGenerator_01970578;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                            *)(local_150 + 8));
        MessageGenerator::~MessageGenerator((MessageGenerator *)local_180);
        uVar17 = extraout_RDX_03;
      }
      lVar27 = lVar27 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0xa0;
    } while (lVar27 < pDVar15->nested_type_count_);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (pDVar15->field_count_ < 1) {
    iVar19 = 0;
  }
  else {
    lVar21 = 0;
    lVar27 = 0;
    iVar19 = 0;
    do {
      pIVar13 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                get(&this->field_generators_,
                    (FieldDescriptor *)(&pDVar15->fields_->super_SymbolBase + lVar21));
      iVar12 = (*(pIVar13->super_FieldGenerator)._vptr_FieldGenerator[3])(pIVar13);
      iVar19 = iVar19 + iVar12;
      lVar27 = lVar27 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x58;
      uVar17 = extraout_RDX_04;
    } while (lVar27 < pDVar15->field_count_);
  }
  if (0 < iVar19) {
    uVar20 = iVar19 + 0x1fU >> 5;
    uVar28 = 1;
    if (1 < uVar20) {
      uVar28 = uVar20;
    }
    uVar20 = 0;
    do {
      GetBitFieldName_abi_cxx11_((string *)local_180,(java *)(ulong)uVar20,(int)uVar17);
      text._M_str = "private int $bit_field_name$;\n";
      text._M_len = 0x1e;
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,text,(char (*) [15])"bit_field_name",(string *)local_180);
      uVar17 = extraout_RDX_05;
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
        uVar17 = extraout_RDX_06;
      }
      uVar20 = uVar20 + 1;
    } while (uVar28 != uVar20);
  }
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_180,(char (*) [2])0x122a33e,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_150,(char (*) [2])0x12347b2,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)local_100._M_local_buf,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_180,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_120,0,(hasher *)&local_1a8,(key_equal *)local_120,(allocator_type *)&local_b8)
  ;
  lVar21 = -0x60;
  plVar25 = local_130;
  do {
    if (plVar25 != (long *)plVar25[-2]) {
      operator_delete((long *)plVar25[-2],*plVar25 + 1);
    }
    plVar25 = plVar25 + -6;
    lVar21 = lVar21 + 0x30;
  } while (lVar21 != 0);
  this_00 = &(this->super_MessageGenerator).oneofs_;
  iVar30 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_b8.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar30.node_;
  local_b8.position_ = iVar30.position_;
  iVar30 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  local_88 = iVar30.node_;
  local_dc = iVar30.position_;
  while( true ) {
    other.position_ = local_dc;
    other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                   *)local_88;
    other._12_4_ = 0;
    bVar11 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
             ::Equals(&local_b8,other);
    if (bVar11) break;
    ppVar14 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::operator*(&local_b8);
    oneof = ppVar14->second;
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_180,&local_100,(char (*) [11])0x132d046);
    std::__cxx11::string::_M_assign((string *)(local_180._8_8_ + 0x10));
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_180,&local_100,(char (*) [23])"oneof_capitalized_name");
    std::__cxx11::string::_M_assign((string *)(local_180._8_8_ + 0x10));
    aVar3.slot_ = (slot_type *)(local_180 + 0x10);
    pcVar22 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        ((int)((ulong)((long)oneof - (long)oneof->containing_type_->oneof_decls_) >>
                              3) * -0x49249249,(Nonnull<char_*>)aVar3.slot_);
    local_180._0_8_ = pcVar22 + -(long)aVar3.slot_;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    local_180._8_8_ = aVar3.slot_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,aVar3.slot_,pcVar22);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[12]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_120,&local_100,(char (*) [12])"oneof_index");
    std::__cxx11::string::operator=((string *)(local_120._8_8_ + 0x10),(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                               local_1a8.field_2._M_local_buf[0]) + 1);
    }
    if ((this->context_->options_).opensource_runtime == true) {
      text_26._M_str =
           "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n";
      text_26._M_len = 0x4b;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_100,text_26);
    }
    text_27._M_str = "public enum ${$$oneof_capitalized_name$Case$}$ {\n";
    text_27._M_len = 0x31;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_100,text_27);
    begin_varname_00._M_str = "{";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "}";
    end_varname_00._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_00,end_varname_00,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    if (0 < oneof->field_count_) {
      lVar27 = 0;
      lVar21 = 0;
      do {
        pFVar18 = oneof->fields_;
        puVar6 = *(ushort **)((long)&(pFVar18->all_names_).payload_ + lVar27);
        uVar4 = *puVar6;
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::resize((ulong)&local_1a8,(char)uVar4);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper
                  (local_1a8._M_dataplus._M_p,(Nullable<const_char_*>)((long)puVar6 + ~(ulong)uVar4)
                   ,(ulong)uVar4);
        aVar3.slot_ = (slot_type *)(local_180 + 0x10);
        pcVar22 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)&pFVar18->number_ + lVar27),
                             (Nonnull<char_*>)aVar3.slot_);
        local_180._0_8_ = pcVar22 + -(long)aVar3.slot_;
        local_120._0_8_ = local_120 + 0x10;
        local_180._8_8_ = aVar3.slot_;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,aVar3.slot_,pcVar22);
        text_00._M_str = "$field_name$($field_number$),\n";
        text_00._M_len = 0x1e;
        io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  (printer,text_00,(char (*) [11])0x13782c1,&local_1a8,(char (*) [13])0x1321453,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,CONCAT71(local_120._17_7_,local_120[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                   local_1a8.field_2._M_local_buf[0]) + 1);
        }
        begin_varname_01._M_str = "field_name";
        begin_varname_01._M_len = 10;
        end_varname_01._M_str = "field_name";
        end_varname_01._M_len = 10;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (printer,begin_varname_01,end_varname_01,
                   (FieldDescriptor *)(&pFVar18->super_SymbolBase + lVar27),
                   (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
        lVar21 = lVar21 + 1;
        lVar27 = lVar27 + 0x58;
      } while (lVar21 < oneof->field_count_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1a8,&local_100,(char (*) [11])0x132d046);
    pcVar9 = (Nullable<const_char_*>)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1a8._M_string_length + 0x10))->_M_allocated_capacity;
    sVar24 = *(size_t *)(local_1a8._M_string_length + 0x18);
    local_180._0_8_ = local_180 + 0x10;
    local_180._8_8_ = (slot_type *)0x0;
    local_180[0x10] = false;
    std::__cxx11::string::resize((ulong)local_180,(char)sVar24);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_180._0_8_,pcVar9,sVar24);
    text_01._M_str = "$cap_oneof_name$_NOT_SET(0);\n";
    text_01._M_len = 0x1d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_01,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
    }
    text_28._M_str =
         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
    ;
    text_28._M_len = 99;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_100,text_28);
    if ((this->context_->options_).opensource_runtime == true) {
      text_29._M_str =
           "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\n"
      ;
      text_29._M_len = 0xb0;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_100,text_29);
    }
    if ((this->context_->options_).opensource_runtime == false) {
      text_02._M_str = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n";
      text_02._M_len = 0x37;
      io::Printer::Print<>(printer,text_02);
    }
    text_30._M_str =
         "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n";
    text_30._M_len = 0x55;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_100,text_30);
    if (0 < oneof->field_count_) {
      lVar27 = 8;
      lVar21 = 0;
      do {
        pFVar18 = oneof->fields_;
        aVar3.slot_ = (slot_type *)(local_180 + 0x10);
        pcVar22 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)pFVar18 + lVar27 + -4),(Nonnull<char_*>)aVar3.slot_)
        ;
        local_180._0_8_ = pcVar22 + -(long)aVar3.slot_;
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_180._8_8_ = aVar3.slot_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,aVar3.slot_,pcVar22);
        puVar6 = *(ushort **)(&pFVar18->super_SymbolBase + lVar27);
        uVar4 = *puVar6;
        local_120._8_8_ = 0;
        local_120._0_8_ = local_120 + 0x10;
        local_120[0x10] = false;
        std::__cxx11::string::resize((ulong)local_120,(char)uVar4);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper
                  ((Nonnull<char_*>)local_120._0_8_,
                   (Nullable<const_char_*>)((long)puVar6 + ~(ulong)uVar4),(ulong)uVar4);
        text_03._M_str = "    case $field_number$: return $field_name$;\n";
        text_03._M_len = 0x2e;
        io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                  (printer,text_03,(char (*) [13])0x1321453,&local_1a8,(char (*) [11])0x13782c1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,CONCAT71(local_120._17_7_,local_120[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                   local_1a8.field_2._M_local_buf[0]) + 1);
        }
        lVar21 = lVar21 + 1;
        lVar27 = lVar27 + 0x58;
      } while (lVar21 < oneof->field_count_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1a8,&local_100,(char (*) [11])0x132d046);
    pcVar9 = (Nullable<const_char_*>)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1a8._M_string_length + 0x10))->_M_allocated_capacity;
    sVar24 = *(size_t *)(local_1a8._M_string_length + 0x18);
    local_180._0_8_ = local_180 + 0x10;
    local_180._8_8_ = (slot_type *)0x0;
    local_180[0x10] = false;
    std::__cxx11::string::resize((ulong)local_180,(char)sVar24);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_180._0_8_,pcVar9,sVar24);
    text_04._M_str =
         "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
    ;
    text_04._M_len = 0x7d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_04,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
    }
    io::Printer::Outdent(printer);
    text_05._M_str = "};\n\n";
    text_05._M_len = 4;
    io::Printer::Print<>(printer,text_05);
    text_31._M_str =
         "@java.lang.Override\npublic $oneof_capitalized_name$Case\n${$get$oneof_capitalized_name$Case$}$() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n"
    ;
    text_31._M_len = 0xaf;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_100,text_31);
    begin_varname_02._M_str = "{";
    begin_varname_02._M_len = 1;
    end_varname_02._M_str = "}";
    end_varname_02._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_02,end_varname_02,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_32._M_str =
         "\nprivate void ${$clear$oneof_capitalized_name$$}$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
    ;
    text_32._M_len = 0x6a;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_100,text_32);
    begin_varname_03._M_str = "{";
    begin_varname_03._M_len = 1;
    end_varname_03._M_str = "}";
    end_varname_03._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_03,end_varname_03,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment(&local_b8);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar15->field_count_) {
    lVar21 = 0;
    lVar27 = 0;
    pFVar18 = extraout_RDX_07;
    do {
      if (lVar27 < pDVar15->field_count_) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar27,(long)pDVar15->field_count_,"index < field_count()");
        pFVar18 = extraout_RDX_09;
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
LAB_00ea6b03:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_180);
      }
      FieldConstantName_abi_cxx11_
                (&local_1a8,(java *)(&pDVar15->fields_->super_SymbolBase + lVar21),pFVar18);
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar23 = (long)pDVar15->field_count_;
      if (lVar27 < lVar23) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar27,lVar23,"index < field_count()");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      aVar3.slot_ = (slot_type *)(local_180 + 0x10);
      pcVar22 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&pDVar15->fields_->number_ + lVar21),
                           (Nonnull<char_*>)aVar3.slot_);
      local_180._0_8_ = pcVar22 + -(long)aVar3.slot_;
      local_120._0_8_ = local_120 + 0x10;
      local_180._8_8_ = aVar3.slot_;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,aVar3.slot_,pcVar22);
      text_06._M_str = "public static final int $constant_name$ = $number$;\n";
      text_06._M_len = 0x34;
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,text_06,(char (*) [14])0x136f876,&local_1a8,(char (*) [7])0x11a6d37,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,CONCAT71(local_120._17_7_,local_120[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar23 = (long)pDVar15->field_count_;
      if (lVar27 < lVar23) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar27,lVar23,"index < field_count()");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
        goto LAB_00ea6b03;
      }
      begin_varname_04._M_str = "constant_name";
      begin_varname_04._M_len = 0xd;
      end_varname_04._M_str = "constant_name";
      end_varname_04._M_len = 0xd;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,begin_varname_04,end_varname_04,
                 (FieldDescriptor *)(&pDVar15->fields_->super_SymbolBase + lVar21),
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar23 = (long)pDVar15->field_count_;
      if (lVar27 < lVar23) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar27,lVar23,"index < field_count()");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
        goto LAB_00ea6b03;
      }
      pIVar13 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                get(&this->field_generators_,
                    (FieldDescriptor *)(&pDVar15->fields_->super_SymbolBase + lVar21));
      (*(pIVar13->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar13,printer);
      text_07._M_str = "\n";
      text_07._M_len = 1;
      io::Printer::Print<>(printer,text_07);
      lVar27 = lVar27 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x58;
      pFVar18 = extraout_RDX_08;
    } while (lVar27 < pDVar15->field_count_);
  }
  GenerateParseFromMethods(this,printer);
  ppuVar2 = (undefined **)(local_180 + 0x10);
  GenerateBuilder(this,printer);
  bVar11 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar11) {
    text_08._M_str = "private byte memoizedIsInitialized = 2;\n";
    text_08._M_len = 0x28;
    io::Printer::Print<>(printer,text_08);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_180,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_09._M_str =
       "@java.lang.Override\n@java.lang.SuppressWarnings({\"ThrowNull\"})\nprotected final java.lang.Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    java.lang.Object arg0, java.lang.Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
  ;
  text_09._M_len = 0x142;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_09,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  if ((undefined **)local_180._0_8_ != ppuVar2) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  text_10._M_str = "case NEW_BUILDER: {\n";
  text_10._M_len = 0x14;
  io::Printer::Print<>(printer,text_10);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_11._M_str = "return new Builder();\n";
  text_11._M_len = 0x16;
  io::Printer::Print<>(printer,text_11);
  io::Printer::Outdent(printer);
  text_12._M_str = "}\ncase BUILD_MESSAGE_INFO: {\n";
  text_12._M_len = 0x1d;
  io::Printer::Print<>(printer,text_12);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateDynamicMethodNewBuildMessageInfo(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_180,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_13._M_str =
       "}\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  com.google.protobuf.Parser<$classname$> parser = PARSER;\n  if (parser == null) {\n    synchronized ($classname$.class) {\n      parser = PARSER;\n      if (parser == null) {\n        parser =\n            new DefaultInstanceBasedParser<$classname$>(\n                DEFAULT_INSTANCE);\n        PARSER = parser;\n      }\n    }\n  }\n  return parser;\n"
  ;
  text_13._M_len = 0x1a5;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_13,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  if ((undefined **)local_180._0_8_ != ppuVar2) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
  }
  bVar11 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  sVar24 = 0xe7;
  if (bVar11) {
    sVar24 = 0xb6;
  }
  pcVar29 = 
  "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return (byte) 1;\n}\n// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n// So it can do anything. Combine with default case for smaller codegen.\ncase SET_MEMOIZED_IS_INITIALIZED:\n"
  ;
  if (bVar11) {
    pcVar29 = 
    "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return memoizedIsInitialized;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n  return null;\n}\n"
    ;
  }
  text_14._M_str = pcVar29;
  text_14._M_len = sVar24;
  io::Printer::Print<>(printer,text_14);
  io::Printer::Outdent(printer);
  text_15._M_str =
       "}\n// Should never happen. Generates tight code to throw an exception.\nthrow null;\n";
  text_15._M_len = 0x52;
  io::Printer::Print<>(printer,text_15);
  io::Printer::Outdent(printer);
  text_16._M_str = "}\n\n";
  text_16._M_len = 3;
  io::Printer::Print<>(printer,text_16);
  pcVar29 = (((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_180._0_8_ = ZEXT28(*(ushort *)(pcVar29 + 2));
  local_180._8_8_ = pcVar29 + ~local_180._0_8_;
  text_17._M_str = "\n// @@protoc_insertion_point(class_scope:$full_name$)\n";
  text_17._M_len = 0x36;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_17,(char (*) [10])0x13f0d39,
             (basic_string_view<char,_std::char_traits<char>_> *)local_180);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_180,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_18._M_str = "private static final $classname$ DEFAULT_INSTANCE;\n";
  text_18._M_len = 0x33;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_18,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  if ((undefined **)local_180._0_8_ != ppuVar2) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
  }
  puVar6 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_180._0_8_ = ZEXT28(*puVar6);
  local_180._8_8_ = (long)puVar6 + ~local_180._0_8_;
  text_19._M_str =
       "static {\n  $classname$ defaultInstance = new $classname$();\n  // New instances are implicitly immutable so no need to make\n  // immutable.\n  DEFAULT_INSTANCE = defaultInstance;\n  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n    $classname$.class, defaultInstance);\n}\n\n"
  ;
  text_19._M_len = 0x121;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_19,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)local_180);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_180,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_20._M_str =
       "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n";
  text_20._M_len = 0x4f;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_20,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  if ((undefined **)local_180._0_8_ != ppuVar2) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  psVar10 = pDVar15->file_->name_;
  if ((psVar10->_M_string_length == 0x1e) &&
     (iVar19 = bcmp((psVar10->_M_dataplus)._M_p,"google/protobuf/wrappers.proto",0x1e), iVar19 == 0)
     ) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_180,this->name_resolver_,pDVar15,true);
    pDVar15 = (this->super_MessageGenerator).descriptor_;
    lVar21 = (long)pDVar15->field_count_;
    if (lVar21 < 1) {
      pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (0,lVar21,"index < field_count()");
    }
    else {
      pcVar16 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar16 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar16);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1a8);
    }
    type = GetJavaType(pDVar15->fields_);
    local_120._0_16_ = (undefined1  [16])PrimitiveTypeName(type);
    text_21._M_str =
         "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
    ;
    text_21._M_len = 0x65;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
              (printer,text_21,(char (*) [10])0x134d25a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
               (char (*) [11])0x13a572d,
               (basic_string_view<char,_std::char_traits<char>_> *)local_120);
    if ((undefined **)local_180._0_8_ != ppuVar2) {
      operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
    }
  }
  puVar6 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_180._0_8_ = ZEXT28(*puVar6);
  local_180._8_8_ = (long)puVar6 + ~local_180._0_8_;
  text_22._M_str =
       "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return DEFAULT_INSTANCE.getParserForType();\n}\n"
  ;
  text_22._M_len = 0xba;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_22,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)local_180);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar15->extension_count_) {
    lVar21 = 0;
    lVar27 = 0;
    do {
      ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)local_180,
                 (FieldDescriptor *)(&pDVar15->extensions_->super_SymbolBase + lVar21),
                 this->context_);
      ImmutableExtensionLiteGenerator::Generate
                ((ImmutableExtensionLiteGenerator *)local_180,printer);
      ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)local_180);
      lVar27 = lVar27 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x58;
    } while (lVar27 < pDVar15->extension_count_);
  }
  io::Printer::Outdent(printer);
  text_23._M_str = "}\n\n";
  text_23._M_len = 3;
  io::Printer::Print<>(printer,text_23);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_100);
  if ((bool *)local_d8.first.ctrl_ != &local_d8.second) {
    operator_delete(local_d8.first.ctrl_,CONCAT71(local_d8._17_7_,local_d8.second) + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_a8);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  absl::flat_hash_map<absl::string_view, std::string> variables = {{"{", ""},
                                                                   {"}", ""}};
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = std::string(descriptor_->name());
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = absl::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Annotate("{", "}", descriptor_);
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  absl::flat_hash_map<absl::string_view, std::string> vars = {{"{", ""},
                                                              {"}", ""}};
  for (auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = absl::StrCat((oneof)->index());
    if (context_->options().opensource_runtime) {
      // oneofCase_ and oneof_
      printer->Print(vars,
                     "private int $oneof_name$Case_ = 0;\n"
                     "private java.lang.Object $oneof_name$_;\n");
    }
    // OneofCase enum
    printer->Print(vars, "public enum ${$$oneof_capitalized_name$Case$}$ {\n");
    printer->Annotate("{", "}", oneof);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     absl::AsciiStrToUpper(field->name()), "field_number",
                     absl::StrCat(field->number()));
      printer->Annotate("field_name", field);
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          vars,
          "/**\n"
          " * @deprecated Use {@link #forNumber(int)} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
          "  return forNumber(value);\n"
          "}\n"
          "\n");
    }
    if (!context_->options().opensource_runtime) {
      printer->Print(
          "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    }
    printer->Print(
        vars,
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", absl::StrCat(field->number()),
                     "field_name", absl::AsciiStrToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO: Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "${$get$oneof_capitalized_name$Case$}$() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n");
    printer->Annotate("{", "}", oneof);
    printer->Print(vars,
                   "\n"
                   "private void ${$clear$oneof_capitalized_name$$}$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
    printer->Annotate("{", "}", oneof);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", absl::StrCat(descriptor_->field(i)->number()));
    printer->Annotate("constant_name", descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"ThrowNull\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n"
        "// So it can do anything. Combine with default case for smaller "
        "codegen.\n"
        "case SET_MEMOIZED_IS_INITIALIZED:\n");
  }

  printer->Outdent();
  printer->Print(
      "}\n"
      "// Should never happen. Generates tight code to throw an exception.\n"
      "throw null;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}